

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trace.h
# Opt level: O2

void __thiscall
NULLC::TraceArray<NULLC::TraceScopeToken>::TraceArray
          (TraceArray<NULLC::TraceScopeToken> *this,uint size)

{
  TraceScopeToken *pTVar1;
  TraceScopeToken *pTVar2;
  
  this->count = 0;
  this->max = size;
  if (size == 0) {
    pTVar1 = (TraceScopeToken *)0x0;
  }
  else {
    pTVar1 = (TraceScopeToken *)operator_new__((ulong)size * 0x10);
    pTVar2 = pTVar1;
    do {
      pTVar2->category = "";
      pTVar2->name = "";
      pTVar2 = pTVar2 + 1;
    } while (pTVar2 != pTVar1 + size);
  }
  this->data = pTVar1;
  return;
}

Assistant:

TraceArray(unsigned size)
		{
			count = 0;
			max = size;

			if(size)
				data = new T[size];
			else
				data = NULL;
		}